

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iot_c_utility.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  char **argv_local;
  int argc_local;
  
  iVar1 = platform_init();
  if (iVar1 == 0) {
    show_platform_info();
    show_sastoken_example();
    http_examples();
    test_http_proxy_io();
    platform_deinit();
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/samples/iot_c_utility/iot_c_utility.c"
                ,"main",0x46,1,"Cannot initialize platform.\n");
    }
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    (void)argc, (void)argv;

    if (platform_init() != 0)
    {
        LogError("Cannot initialize platform.\n");
    }
    else
    {
        show_platform_info();
        show_sastoken_example();
#ifdef USE_HTTP
        http_examples();
        test_http_proxy_io();
#endif
        platform_deinit();
    }
    return 0;
}